

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidget::paint
          (QGraphicsProxyWidget *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  long lVar1;
  long lVar2;
  QRect QVar3;
  bool bVar4;
  int iVar5;
  GraphicsItemFlags GVar6;
  qreal qVar7;
  long *plVar8;
  QWidget *this_00;
  long in_FS_OFFSET;
  QRegion local_88;
  undefined8 uStack_80;
  QSizeF local_78;
  QRectF local_68;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x18);
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x208));
  QVar3.x2.m_i = local_48.x2.m_i;
  QVar3.y2.m_i = local_48.y2.m_i;
  QVar3.x1.m_i = local_48.x1.m_i;
  QVar3.y1.m_i = local_48.y1.m_i;
  if ((bVar4) &&
     (local_48 = QVar3, (*(byte *)(*(long *)(*(long *)(lVar1 + 0x210) + 0x20) + 9) & 0x80) != 0)) {
    local_78 = QGraphicsWidget::size((QGraphicsWidget *)this);
    local_88.d = (QRegionData *)0x0;
    uStack_80 = 0;
    QRectF::operator&(&local_68,(QRectF *)&option->exposedRect);
    local_48 = (QRect)QRectF::toAlignedRect();
    qVar7 = local_48._0_8_;
    if ((local_48.x1.m_i.m_i <= local_48.x2.m_i.m_i) && (local_48.y1.m_i.m_i <= local_48.y2.m_i.m_i)
       ) {
      plVar8 = (long *)QPainter::device();
      iVar5 = (**(code **)(*plVar8 + 0x10))(plVar8);
      if (iVar5 != 1) {
        GVar6 = QGraphicsItem::flags((QGraphicsItem *)(this + 0x10));
        if (((uint)GVar6.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                   super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 0x10) != 0) {
          QPainter::setClipRect
                    ((QRect *)painter,(int)*(undefined8 *)(*(long *)(lVar1 + 0x210) + 0x20) + 0x14);
        }
      }
      lVar2 = *(long *)(lVar1 + 0x208);
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        this_00 = (QWidget *)0x0;
      }
      else {
        this_00 = *(QWidget **)(lVar1 + 0x210);
      }
      local_68.xp = qVar7;
      QRegion::QRegion(&local_88,&local_48,Rectangle);
      QWidget::render(this_00,painter,(QPoint *)&local_68,&local_88,(RenderFlags)0x3);
      QRegion::~QRegion(&local_88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::paint(QPainter *painter, const QStyleOptionGraphicsItem *option, QWidget *widget)
{
    Q_D(QGraphicsProxyWidget);
    Q_UNUSED(widget);
    if (!d->widget || !d->widget->isVisible())
        return;

    // Filter out repaints on the window frame.
    const QRect exposedWidgetRect = (option->exposedRect & rect()).toAlignedRect();
    if (exposedWidgetRect.isEmpty())
        return;

    // When rendering to pdf etc. painting may go outside widget boundaries unless clipped
    if (painter->device()->devType() != QInternal::Widget && (flags() & ItemClipsChildrenToShape))
        painter->setClipRect(d->widget->geometry(), Qt::IntersectClip);

    d->widget->render(painter, exposedWidgetRect.topLeft(), exposedWidgetRect);
}